

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O2

char NpyArray::getTypeChar(type_info *t)

{
  bool bVar1;
  char cVar2;
  
  bVar1 = std::type_info::operator==(t,(type_info *)&float::typeinfo);
  cVar2 = 'f';
  if (!bVar1) {
    bVar1 = std::type_info::operator==(t,(type_info *)&double::typeinfo);
    if (!bVar1) {
      bVar1 = std::type_info::operator==(t,(type_info *)&long_double::typeinfo);
      if (!bVar1) {
        bVar1 = std::type_info::operator==(t,(type_info *)&int::typeinfo);
        cVar2 = 'i';
        if (!bVar1) {
          bVar1 = std::type_info::operator==(t,(type_info *)&char::typeinfo);
          if (!bVar1) {
            bVar1 = std::type_info::operator==(t,(type_info *)&short::typeinfo);
            if (!bVar1) {
              bVar1 = std::type_info::operator==(t,(type_info *)&long::typeinfo);
              if (!bVar1) {
                bVar1 = std::type_info::operator==(t,(type_info *)&long_long::typeinfo);
                if (!bVar1) {
                  bVar1 = std::type_info::operator==(t,(type_info *)&unsigned_char::typeinfo);
                  cVar2 = 'u';
                  if (!bVar1) {
                    bVar1 = std::type_info::operator==(t,(type_info *)&unsigned_short::typeinfo);
                    if (!bVar1) {
                      bVar1 = std::type_info::operator==(t,(type_info *)&unsigned_long::typeinfo);
                      if (!bVar1) {
                        bVar1 = std::type_info::operator==
                                          (t,(type_info *)&unsigned_long_long::typeinfo);
                        if (!bVar1) {
                          bVar1 = std::type_info::operator==(t,(type_info *)&unsigned_int::typeinfo)
                          ;
                          if (!bVar1) {
                            bVar1 = std::type_info::operator==(t,(type_info *)&bool::typeinfo);
                            cVar2 = 'b';
                            if (!bVar1) {
                              bVar1 = std::type_info::operator==
                                                (t,(type_info *)&std::complex<float>::typeinfo);
                              cVar2 = 'c';
                              if (!bVar1) {
                                bVar1 = std::type_info::operator==
                                                  (t,(type_info *)&std::complex<double>::typeinfo);
                                if (!bVar1) {
                                  bVar1 = std::type_info::operator==
                                                    (t,(type_info *)
                                                       &std::complex<long_double>::typeinfo);
                                  cVar2 = '?';
                                  if (bVar1) {
                                    cVar2 = 'c';
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return cVar2;
}

Assistant:

char NpyArray::getTypeChar(const std::type_info& t)
{
	if (t == typeid(float)) return 'f';
	if (t == typeid(double)) return 'f';
	if (t == typeid(long double)) return 'f';

	if (t == typeid(int)) return 'i';
	if (t == typeid(char)) return 'i';
	if (t == typeid(short)) return 'i';
	if (t == typeid(long)) return 'i';
	if (t == typeid(long long)) return 'i';

	if (t == typeid(uint8_t)) return 'u';
	if (t == typeid(unsigned short)) return 'u';
	if (t == typeid(unsigned long)) return 'u';
	if (t == typeid(unsigned long long)) return 'u';
	if (t == typeid(unsigned int)) return 'u';

	if (t == typeid(bool)) return 'b';

	if (t == typeid(std::complex<float>)) return 'c';
	if (t == typeid(std::complex<double>)) return 'c';
	if (t == typeid(std::complex<long double>)) return 'c';

	return '?';
}